

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O2

MPP_RET hal_jpege_vepu511_prepare(void *hal)

{
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","enter %p\n","hal_jpege_vepu511_prepare",hal);
  }
  vepu541_set_fmt(*(VepuFmtCfg **)((long)hal + 0xd8),
                  *(MppFrameFormat *)(*(long *)((long)hal + 0xa0) + 0x24));
  if (((byte)hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_v511","leave %p\n","hal_jpege_vepu511_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_jpege_vepu511_prepare(void *hal)
{
    JpegeV511HalContext *ctx = (JpegeV511HalContext *)hal;

    hal_jpege_dbg_func("enter %p\n", hal);
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);

    hal_jpege_dbg_func("leave %p\n", hal);

    return MPP_OK;
}